

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void util::
     hex_dump<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                it,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   itEnd,int start_offset,colour *pColours,size_t per_line)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  LogHelper *pLVar4;
  byte *pbVar5;
  size_t sVar6;
  char local_91;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  byte local_82;
  colour local_81;
  uchar b;
  ulong uStack_80;
  colour new_colour;
  size_t i;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string text;
  size_t base_offset;
  colour c;
  size_t per_line_local;
  colour *pColours_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_18;
  int start_offset_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  itEnd_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it_local;
  
  _Stack_18._M_current = itEnd._M_current;
  itEnd_local = it;
  if (per_line != 0) {
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&itEnd_local,(long)start_offset);
    per_line_local = (size_t)pColours;
    if (pColours != (colour *)0x0) {
      per_line_local = (size_t)(pColours + start_offset);
    }
    base_offset._7_1_ = none;
    text.field_2._8_8_ = (long)start_offset - (ulong)(long)start_offset % per_line;
    pColours_local._4_4_ = (int)((ulong)(long)start_offset % per_line);
    while (bVar2 = __gnu_cxx::operator<(&itEnd_local,&stack0xffffffffffffffe8), bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,per_line,' ',&local_61);
      std::allocator<char>::~allocator(&local_61);
      if (base_offset._7_1_ != none) {
        operator<<((LogHelper *)&cout,none);
        base_offset._7_1_ = none;
      }
      pLVar4 = operator<<((LogHelper *)&cout,
                          "0123456789ABCDEF" + ((uint)text.field_2._8_4_ >> 0xc & 0xf));
      pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + ((uint)text.field_2._8_4_ >> 8 & 0xf));
      pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + ((uint)text.field_2._8_4_ >> 4 & 0xf));
      pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + ((uint)text.field_2._8_8_ & 0xf));
      operator<<(pLVar4,(char (*) [3])0x2a704b);
      text.field_2._8_8_ = per_line + text.field_2._8_8_;
      for (uStack_80 = 0; uStack_80 < per_line; uStack_80 = uStack_80 + 1) {
        if ((pColours_local._4_4_ < 1) &&
           (bVar2 = __gnu_cxx::operator<(&itEnd_local,&stack0xffffffffffffffe8), bVar2)) {
          if (per_line_local != 0) {
            sVar6 = per_line_local + 1;
            local_81 = *(colour *)per_line_local;
            per_line_local = sVar6;
            if (local_81 != base_offset._7_1_) {
              operator<<((LogHelper *)&cout,local_81);
              base_offset._7_1_ = local_81;
            }
          }
          local_90 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator++(&itEnd_local,0);
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator*(&local_90);
          local_82 = *pbVar5;
          iVar3 = isprint((uint)local_82);
          bVar1 = local_82;
          if (iVar3 == 0) {
            bVar1 = 0x2e;
          }
          pbVar5 = (byte *)std::__cxx11::string::operator[]((ulong)local_60);
          *pbVar5 = bVar1;
          pLVar4 = operator<<((LogHelper *)&cout,"0123456789ABCDEF" + (local_82 >> 4));
          pLVar4 = operator<<(pLVar4,"0123456789ABCDEF" + (local_82 & 0xf));
          local_91 = ' ';
          operator<<(pLVar4,&local_91);
        }
        else {
          operator<<((LogHelper *)&cout,(char (*) [4])0x2a704a);
        }
        pColours_local._4_4_ = pColours_local._4_4_ + -1;
      }
      pLVar4 = operator<<((LogHelper *)&cout,none);
      pLVar4 = operator<<(pLVar4,(char (*) [2])0x2a704c);
      pLVar4 = operator<<(pLVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_60);
      operator<<(pLVar4,(char (*) [2])0x2a74b6);
      std::__cxx11::string::~string((string *)local_60);
    }
    return;
  }
  __assert_fail("per_line != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/include/utils.h"
                ,0xec,
                "void util::hex_dump(ForwardIter, ForwardIter, int, colour *, size_t) [ForwardIter = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>]"
               );
}

Assistant:

void hex_dump(ForwardIter it, ForwardIter itEnd, int start_offset = 0, colour* pColours = nullptr, size_t per_line = 16)
{
    assert(per_line != 0);
    static const char hex[] = "0123456789ABCDEF";

    it += start_offset;
    if (pColours)
        pColours += start_offset;

    colour c = colour::none;
    auto base_offset = start_offset - (start_offset % per_line);
    start_offset %= per_line;

    while (it < itEnd)
    {
        std::string text(per_line, ' ');

        if (c != colour::none)
        {
            util::cout << colour::none;
            c = colour::none;
        }

        util::cout << hex[(base_offset >> 12) & 0xf] <<
            hex[(base_offset >> 8) & 0xf] <<
            hex[(base_offset >> 4) & 0xf] <<
            hex[base_offset & 0xf] << "  ";

        base_offset += per_line;

        for (size_t i = 0; i < per_line; i++)
        {
            if (start_offset-- <= 0 && it < itEnd)
            {
                if (pColours)
                {
                    auto new_colour = *pColours++;
                    if (new_colour != c)
                    {
                        util::cout << new_colour;
                        c = new_colour;
                    }
                }

                auto b = *it++;
                text[i] = std::isprint(b) ? b : '.';
                util::cout << hex[b >> 4] << hex[b & 0x0f] << ' ';
            }
            else
            {
                util::cout << "   ";
            }
        }

        util::cout << colour::none << " " << text << "\n";
    }
}